

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,2ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *attr,
          string *name,uint32_t indent)

{
  bool bVar1;
  AttrMeta *pAVar2;
  ostream *poVar3;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this_00;
  size_type sVar4;
  const_reference v_00;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_320;
  string local_300;
  string local_2e0 [32];
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260 [32];
  string local_240;
  string local_220;
  string local_200 [32];
  string local_1e0;
  byte local_1bc;
  byte local_1bb;
  byte local_1ba;
  byte local_1b9;
  bool is_value_empty;
  bool has_value;
  bool is_timesamples;
  Animatable<std::array<float,_2UL>_> *pAStack_1b8;
  bool is_connection;
  Animatable<std::array<float,_2UL>_> *v;
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *pTStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *attr_local;
  
  indent_00 = (uint32_t)name;
  local_24 = indent_00;
  pTStack_20 = attr;
  name_local = (string *)this;
  attr_local = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
               __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&v);
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::authored
                    ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                     name_local);
  if (bVar1) {
    pAStack_1b8 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
                  get_value((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                             *)name_local);
    local_1b9 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
                is_connection((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                               *)name_local);
    local_1ba = Animatable<std::array<float,_2UL>_>::is_timesamples(pAStack_1b8);
    local_1bb = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
                has_value((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                           *)name_local);
    local_1bc = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
                is_value_empty((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                *)name_local);
    pAVar2 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::metas
                       ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                         *)name_local);
    bVar1 = AttrMetas::authored(pAVar2);
    if ((((bVar1) || ((local_1bb & 1) != 0)) || ((local_1bc & 1) != 0)) ||
       (((local_1b9 & 1) == 0 && ((local_1ba & 1) == 0)))) {
      if ((local_1bb & 1) == 0) {
        pprint::Indent_abi_cxx11_(&local_240,(pprint *)(ulong)local_24,n);
        ::std::operator<<(aoStack_1a0,(string *)&local_240);
        ::std::__cxx11::string::~string((string *)&local_240);
        value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
        poVar3 = ::std::operator<<(aoStack_1a0,local_260);
        poVar3 = ::std::operator<<(poVar3," ");
        ::std::operator<<(poVar3,(string *)pTStack_20);
        ::std::__cxx11::string::~string(local_260);
      }
      else {
        pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)(ulong)local_24,n);
        ::std::operator<<(aoStack_1a0,(string *)&local_1e0);
        ::std::__cxx11::string::~string((string *)&local_1e0);
        value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
        poVar3 = ::std::operator<<(aoStack_1a0,local_200);
        poVar3 = ::std::operator<<(poVar3," ");
        ::std::operator<<(poVar3,(string *)pTStack_20);
        ::std::__cxx11::string::~string(local_200);
        poVar3 = ::std::operator<<(aoStack_1a0," = ");
        print_animatable_default<std::array<float,2ul>>
                  (&local_220,(tinyusdz *)pAStack_1b8,
                   (Animatable<std::array<float,_2UL>_> *)(ulong)local_24,indent_00);
        ::std::operator<<(poVar3,(string *)&local_220);
        ::std::__cxx11::string::~string((string *)&local_220);
      }
      pAVar2 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::metas
                         ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                           *)name_local);
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = ::std::operator<<(aoStack_1a0," (\n");
        pAVar2 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::metas
                           ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                             *)name_local);
        print_attr_metas_abi_cxx11_
                  (&local_280,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),indent_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_280);
        pprint::Indent_abi_cxx11_(&local_2a0,(pprint *)(ulong)local_24,n_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_2a0);
        ::std::operator<<(poVar3,")");
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::__cxx11::string::~string((string *)&local_280);
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = Animatable<std::array<float,_2UL>_>::has_timesamples(pAStack_1b8);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_2c0,(pprint *)(ulong)local_24,n_01);
      ::std::operator<<(aoStack_1a0,(string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_2c0);
      value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,local_2e0);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string(local_2e0);
      poVar3 = ::std::operator<<(aoStack_1a0,".timeSamples = ");
      print_animatable_timesamples<std::array<float,2ul>>
                (&local_300,(tinyusdz *)pAStack_1b8,
                 (Animatable<std::array<float,_2UL>_> *)(ulong)local_24,indent_00);
      ::std::operator<<(poVar3,(string *)&local_300);
      ::std::__cxx11::string::~string((string *)&local_300);
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
            has_connections((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                             *)name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_320,(pprint *)(ulong)local_24,n_02);
      ::std::operator<<(aoStack_1a0,(string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_320);
      value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)&paths);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string((string *)&paths);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this_00 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
                get_connections((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                 *)name_local);
      sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)this_00);
      if (sVar4 == 1) {
        v_00 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this_00,0)
        ;
        ::std::operator<<(aoStack_1a0,v_00);
      }
      else {
        sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)this_00);
        if (sVar4 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this_00);
        }
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&v);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    bool is_connection = attr.is_connection();
    bool is_timesamples = v.is_timesamples();
    bool has_value = attr.has_value();
    bool is_value_empty = attr.is_value_empty();

    DCOUT("name " << name);
    DCOUT("is_value_empty " << attr.is_value_empty());
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("has_value " << has_value);

    if (attr.metas().authored() || has_value || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      if (has_value) {
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
        ss << " = " << print_animatable_default(v, indent);

      } else { // attr.is_value_empty()
        // declare only
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = " << print_animatable_timesamples(v, indent);
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }

  return ss.str();
}